

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O0

int read_main_header(ingest_info *info)

{
  char cVar1;
  int iVar2;
  long lVar3;
  coda_mem_record *pcVar4;
  long *in_FS_OFFSET;
  long linelength;
  char line [1000];
  coda_dynamic_type *value;
  ingest_info *info_local;
  
  lVar3 = ftell((FILE *)info->f);
  info->offset = lVar3;
  info->linenumber = info->linenumber + 1;
  iVar2 = get_line(info->f,(char *)&linelength);
  lVar3 = (long)iVar2;
  if (lVar3 < 0) {
    info_local._4_4_ = -1;
  }
  else if (lVar3 < 0x3d) {
    coda_set_error(-0x16,"header line length (%ld) too short (line: %ld, byte offset: %ld)",lVar3,
                   info->linenumber,info->offset);
    info_local._4_4_ = -1;
  }
  else {
    iVar2 = strncmp(line + 0x34,"RINEX VERSION / TYPE",0x14);
    if (iVar2 == 0) {
      lVar3 = coda_ascii_parse_double((char *)&linelength,9,&info->format_version,0);
      if (lVar3 < 0) {
        coda_add_error_message(" (line: %ld, byte offset: %ld)",info->linenumber,info->offset);
        info_local._4_4_ = -1;
      }
      else {
        info->file_type = line[0xc];
        cVar1 = info->file_type;
        if (cVar1 == 'C') {
          if (((info->format_version != 2.0) || (NAN(info->format_version))) &&
             ((info->format_version != 3.0 || (NAN(info->format_version))))) {
            coda_set_error(-200,"RINEX format version %3.2f is not supported for Clock data",
                           info->format_version);
            return -1;
          }
          pcVar4 = coda_mem_record_new(*(coda_type_record **)
                                        (*(long *)(*in_FS_OFFSET + -0x1c8) + 0x470),
                                       (coda_dynamic_type *)0x0);
          info->header = pcVar4;
        }
        else if (cVar1 == 'N') {
          if ((info->format_version != 3.0) || (NAN(info->format_version))) {
            coda_set_error(-200,"RINEX format version %3.2f is not supported for Navigation data",
                           info->format_version);
            return -1;
          }
          pcVar4 = coda_mem_record_new(*(coda_type_record **)
                                        (*(long *)(*in_FS_OFFSET + -0x1c8) + 0x3f8),
                                       (coda_dynamic_type *)0x0);
          info->header = pcVar4;
        }
        else {
          if (cVar1 != 'O') {
            coda_set_error(-200,"RINEX file type \'%c\' is not supported",
                           (ulong)(uint)(int)info->file_type);
            return -1;
          }
          if ((info->format_version != 3.0) || (NAN(info->format_version))) {
            coda_set_error(-200,"RINEX format version %3.2f is not supported for Observation data",
                           info->format_version);
            return -1;
          }
          pcVar4 = coda_mem_record_new(*(coda_type_record **)
                                        (*(long *)(*in_FS_OFFSET + -0x1c8) + 0x1a8),
                                       (coda_dynamic_type *)0x0);
          info->header = pcVar4;
        }
        if ((info->format_version != 3.0) || (NAN(info->format_version))) {
          info->satellite_system = 'G';
        }
        else {
          info->satellite_system = line[0x20];
        }
        line._992_8_ = coda_mem_float_new((coda_type_number *)
                                          **(undefined8 **)(*in_FS_OFFSET + -0x1c8),
                                          (coda_dynamic_type *)0x0,info->product,
                                          (float)info->format_version);
        coda_mem_record_add_field(info->header,"format_version",(coda_dynamic_type *)line._992_8_,0)
        ;
        line._992_8_ = coda_mem_char_new(*(coda_type_text **)(*(long *)(*in_FS_OFFSET + -0x1c8) + 8)
                                         ,(coda_dynamic_type *)0x0,info->product,info->file_type);
        coda_mem_record_add_field(info->header,"file_type",(coda_dynamic_type *)line._992_8_,0);
        line._992_8_ = coda_mem_char_new(*(coda_type_text **)
                                          (*(long *)(*in_FS_OFFSET + -0x1c8) + 0x10),
                                         (coda_dynamic_type *)0x0,info->product,
                                         info->satellite_system);
        coda_mem_record_add_field
                  (info->header,"satellite_system",(coda_dynamic_type *)line._992_8_,0);
        info_local._4_4_ = 0;
      }
    }
    else {
      coda_set_error(-0x16,"invalid header item \'%s\' (line: %ld, byte offset: %ld)",line + 0x34,
                     info->linenumber,info->offset + 0x3c);
      info_local._4_4_ = -1;
    }
  }
  return info_local._4_4_;
}

Assistant:

static int read_main_header(ingest_info *info)
{
    coda_dynamic_type *value;
    char line[MAX_LINE_LENGTH];
    long linelength;

    info->offset = ftell(info->f);
    info->linenumber++;
    linelength = get_line(info->f, line);
    if (linelength < 0)
    {
        return -1;
    }
    if (linelength < 61)
    {
        coda_set_error(CODA_ERROR_FILE_READ, "header line length (%ld) too short (line: %ld, byte offset: %ld)",
                       linelength, info->linenumber, info->offset);
        return -1;
    }
    if (strncmp(&line[60], "RINEX VERSION / TYPE", 20) != 0)
    {
        coda_set_error(CODA_ERROR_FILE_READ, "invalid header item '%s' (line: %ld, byte offset: %ld)",
                       &line[60], info->linenumber, info->offset + 60);
        return -1;
    }
    if (coda_ascii_parse_double(line, 9, &info->format_version, 0) < 0)
    {
        coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset);
        return -1;
    }
    info->file_type = line[20];

    switch (info->file_type)
    {
        case 'O':
            if (info->format_version != 3.0)
            {
                coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "RINEX format version %3.2f is not supported for "
                               "Observation data", info->format_version);
                return -1;
            }
            info->header = coda_mem_record_new((coda_type_record *)rinex_type[rinex_obs_header], NULL);
            break;
        case 'N':
            if (info->format_version != 3.0)
            {
                coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "RINEX format version %3.2f is not supported for "
                               "Navigation data", info->format_version);
                return -1;
            }
            info->header = coda_mem_record_new((coda_type_record *)rinex_type[rinex_nav_header], NULL);
            break;
        case 'C':
            if (info->format_version != 2.0 && info->format_version != 3.0)
            {
                coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "RINEX format version %3.2f is not supported for "
                               "Clock data", info->format_version);
                return -1;
            }
            info->header = coda_mem_record_new((coda_type_record *)rinex_type[rinex_clk_header], NULL);
            break;
        default:
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "RINEX file type '%c' is not supported", info->file_type);
            return -1;
    }

    if (info->format_version == 3.0)
    {
        info->satellite_system = line[40];
    }
    else
    {
        /* for older RINEX versions the only supported satellite system is GPS */
        info->satellite_system = 'G';
    }

    value = (coda_dynamic_type *)coda_mem_float_new((coda_type_number *)rinex_type[rinex_format_version], NULL,
                                                    info->product, (float)info->format_version);
    coda_mem_record_add_field(info->header, "format_version", value, 0);
    value = (coda_dynamic_type *)coda_mem_char_new((coda_type_text *)rinex_type[rinex_file_type], NULL, info->product,
                                                   info->file_type);
    coda_mem_record_add_field(info->header, "file_type", value, 0);
    value = (coda_dynamic_type *)coda_mem_char_new((coda_type_text *)rinex_type[rinex_satellite_system], NULL,
                                                   info->product, info->satellite_system);
    coda_mem_record_add_field(info->header, "satellite_system", value, 0);

    return 0;
}